

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void __thiscall crnlib::task_pool::join(task_pool *this)

{
  atomic32_t aVar1;
  bool bVar2;
  task tsk;
  
  tsk.field_2._0_4_ = 0;
  tsk._20_8_ = 0;
  tsk.m_data = 0;
  tsk.m_pData_ptr._0_4_ = 0;
  tsk.m_pData_ptr._4_4_ = 0;
  while( true ) {
    bVar2 = tsstack<crnlib::task_pool::task,_16U>::pop(&this->m_task_stack,&tsk);
    if (!bVar2) break;
    process_task(this,&tsk);
  }
  aVar1 = this->m_total_submitted_tasks;
  while (this->m_total_completed_tasks != (long)(int)aVar1) {
    semaphore::wait(&this->m_all_tasks_completed,(void *)0x1);
  }
  return;
}

Assistant:

void task_pool::join()
    {
        // Try to steal any outstanding tasks. This could cause one or more worker threads to wake up and immediately go back to sleep, which is wasteful but should be harmless.
        task tsk;
        while (m_task_stack.pop(tsk))
        {
            process_task(tsk);
        }

        // At this point the task stack is empty.
        // Now wait for all concurrent tasks to complete. The m_all_tasks_completed semaphore has a max count of 1, so it's possible it could have saturated to 1 as the tasks
        // where issued and asynchronously completed, so this loop may iterate a few times.
        const int total_submitted_tasks = atomic_add32(&m_total_submitted_tasks, 0);
        while (m_total_completed_tasks != total_submitted_tasks)
        {
            // If the previous (m_total_completed_tasks != total_submitted_tasks) check failed the semaphore MUST be eventually signalled once the last task completes.
            // So I think this can actually be an INFINITE delay, but it shouldn't really matter if it's 1ms.
            m_all_tasks_completed.wait(1);
        }
    }